

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_set_page_with_attrs_riscv64
               (CPUState *cpu,target_ulong vaddr,hwaddr paddr,MemTxAttrs attrs,int prot,int mmu_idx,
               target_ulong size)

{
  CPUArchState_conflict24 *env_00;
  size_t sVar1;
  undefined4 uVar2;
  _Bool _Var3;
  int asidx_00;
  uint uVar4;
  uint uVar5;
  CPUTLB_conflict4 *pCVar6;
  ulong addr;
  ulong addr_00;
  MemoryRegionSection *section_00;
  void *pvVar7;
  ram_addr_t rVar8;
  hwaddr hVar9;
  uintptr_t uVar10;
  CPUIOTLBEntry *pCVar11;
  long lVar12;
  CPUIOTLBEntry *pCVar13;
  CPUTLBEntry *tv;
  uint vidx;
  _Bool is_ram;
  int wp_flags;
  int asidx;
  target_ulong vaddr_page;
  hwaddr paddr_page;
  hwaddr sz;
  hwaddr xlat;
  hwaddr iotlb;
  CPUTLBEntry tn;
  CPUTLBEntry *te;
  uintptr_t addend;
  target_ulong write_address;
  target_ulong address;
  uint index;
  MemoryRegionSection *section;
  CPUTLBDesc *desc;
  CPUTLB_conflict4 *tlb;
  CPUArchState_conflict24 *env;
  int mmu_idx_local;
  int prot_local;
  hwaddr paddr_local;
  target_ulong vaddr_local;
  CPUState *cpu_local;
  MemTxAttrs attrs_local;
  
  env_00 = (CPUArchState_conflict24 *)cpu->env_ptr;
  env._0_4_ = mmu_idx;
  env._4_4_ = prot;
  _mmu_idx_local = paddr;
  paddr_local = vaddr;
  vaddr_local = (target_ulong)cpu;
  cpu_local._4_4_ = attrs;
  pCVar6 = env_tlb(env_00);
  lVar12 = (long)(int)env;
  asidx_00 = cpu_asidx_from_attrs((CPUState *)vaddr_local,cpu_local._4_4_);
  if (size < 0x1001) {
    paddr_page = 0x1000;
  }
  else {
    tlb_add_large_page(env_00,(int)env,paddr_local,size);
    paddr_page = size;
  }
  addr = paddr_local & 0xfffffffffffff000;
  addr_00 = _mmu_idx_local & 0xfffffffffffff000;
  section_00 = address_space_translate_for_iotlb_riscv64
                         ((CPUState *)vaddr_local,asidx_00,addr_00,&sz,&paddr_page,cpu_local._4_4_,
                          (int *)((long)&env + 4));
  if (paddr_page < 0x1000) {
    __assert_fail("sz >= TARGET_PAGE_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                  ,0x322,
                  "void tlb_set_page_with_attrs_riscv64(CPUState *, target_ulong, hwaddr, MemTxAttrs, int, int, target_ulong)"
                 );
  }
  write_address = addr;
  if (size < 0x1000) {
    write_address = addr | 0x800;
  }
  if (((uint)cpu_local._4_4_ >> 0x13 & 1) != 0) {
    write_address = write_address | 0x80;
  }
  _Var3 = memory_region_is_ram((MemoryRegion_conflict *)section_00->mr);
  if (_Var3) {
    pvVar7 = memory_region_get_ram_ptr_riscv64((MemoryRegion_conflict *)section_00->mr);
    te = (CPUTLBEntry *)((long)pvVar7 + sz);
  }
  else {
    te = (CPUTLBEntry *)0x0;
  }
  addend = write_address;
  if (_Var3) {
    rVar8 = memory_region_get_ram_addr_riscv64((MemoryRegion_conflict *)section_00->mr);
    xlat = rVar8 + sz;
    if ((env._4_4_ & 2) != 0) {
      if ((section_00->readonly & 1U) == 0) {
        _Var3 = cpu_physical_memory_is_clean(xlat);
        if (_Var3) {
          addend = write_address | 0x400;
        }
      }
      else {
        addend = write_address | 0x40;
      }
    }
  }
  else {
    hVar9 = memory_region_section_get_iotlb_riscv64((CPUState *)vaddr_local,section_00);
    xlat = hVar9 + sz;
    addend = write_address | 0x200;
    write_address = addend;
  }
  uVar4 = cpu_watchpoint_address_matches_riscv64((CPUState *)vaddr_local,addr,0x1000);
  uVar10 = tlb_index(env_00,(long)(int)env,addr);
  tn.field_0._56_8_ = tlb_entry(env_00,(long)(int)env,addr);
  (pCVar6->c).dirty = (pCVar6->c).dirty | (ushort)(1 << ((byte)(int)env & 0x1f));
  tlb_flush_vtlb_page_locked(env_00,(int)env,addr);
  _Var3 = tlb_hit_page_anyprot(env_00->uc,(CPUTLBEntry *)tn.field_0._56_8_,addr);
  if ((!_Var3) && (_Var3 = tlb_entry_is_empty((CPUTLBEntry *)tn.field_0._56_8_), !_Var3)) {
    sVar1 = pCVar6->d[lVar12].vindex;
    pCVar6->d[lVar12].vindex = sVar1 + 1;
    uVar5 = (uint)sVar1 & 7;
    copy_tlb_helper_locked(pCVar6->d[lVar12].vtable + uVar5,(CPUTLBEntry *)tn.field_0._56_8_);
    pCVar11 = pCVar6->d[lVar12].viotlb + uVar5;
    pCVar13 = pCVar6->d[lVar12].iotlb + (uVar10 & 0xffffffff);
    pCVar11->addr = pCVar13->addr;
    uVar2 = *(undefined4 *)&pCVar13->field_0xc;
    pCVar11->attrs = pCVar13->attrs;
    *(undefined4 *)&pCVar11->field_0xc = uVar2;
    tlb_n_used_entries_dec(env_00,(long)(int)env);
  }
  pCVar6->d[lVar12].iotlb[uVar10 & 0xffffffff].addr = xlat - addr;
  pCVar6->d[lVar12].iotlb[uVar10 & 0xffffffff].attrs = cpu_local._4_4_;
  tn.field_0._24_8_ = (long)te - addr;
  if ((env._4_4_ & 1) == 0) {
    iotlb = 0xffffffffffffffff;
  }
  else {
    iotlb = write_address;
    if ((uVar4 & 1) != 0) {
      iotlb = write_address | 0x100;
    }
  }
  if ((env._4_4_ & 4) == 0) {
    tn.field_0._8_8_ = 0xffffffffffffffff;
  }
  else {
    tn.field_0._8_8_ = write_address;
  }
  tn.field_0._0_8_ = 0xffffffffffffffff;
  if ((env._4_4_ & 2) != 0) {
    tn.field_0._0_8_ = addend;
    if ((env._4_4_ & 0x40) != 0) {
      tn.field_0._0_8_ = addend | 0x800;
    }
    if ((uVar4 & 2) != 0) {
      tn.field_0._0_8_ = tn.field_0._0_8_ | 0x100;
    }
  }
  tn.field_0._16_8_ = addr_00;
  copy_tlb_helper_locked((CPUTLBEntry *)tn.field_0._56_8_,(CPUTLBEntry *)&iotlb);
  tlb_n_used_entries_inc(env_00,(long)(int)env);
  return;
}

Assistant:

void tlb_set_page_with_attrs(CPUState *cpu, target_ulong vaddr,
                             hwaddr paddr, MemTxAttrs attrs, int prot,
                             int mmu_idx, target_ulong size)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    CPUTLB *tlb = env_tlb(env);
    CPUTLBDesc *desc = &tlb->d[mmu_idx];
    MemoryRegionSection *section;
    unsigned int index;
    target_ulong address;
    target_ulong write_address;
    uintptr_t addend;
    CPUTLBEntry *te, tn;
    hwaddr iotlb, xlat, sz, paddr_page;
    target_ulong vaddr_page;
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    int wp_flags;
    bool is_ram;

    // assert_cpu_is_self(cpu);

    if (size <= TARGET_PAGE_SIZE) {
        sz = TARGET_PAGE_SIZE;
    } else {
        tlb_add_large_page(env, mmu_idx, vaddr, size);
        sz = size;
    }
    vaddr_page = vaddr & TARGET_PAGE_MASK;
    paddr_page = paddr & TARGET_PAGE_MASK;

    section = address_space_translate_for_iotlb(cpu, asidx, paddr_page,
                                                &xlat, &sz, attrs, &prot);
    assert(sz >= TARGET_PAGE_SIZE);

    address = vaddr_page;
    if (size < TARGET_PAGE_SIZE) {
        /* Repeat the MMU check and TLB fill on every access.  */
        address |= TLB_INVALID_MASK;
    }
    if (attrs.byte_swap) {
        address |= TLB_BSWAP;
    }

    is_ram = memory_region_is_ram(section->mr);
    // is_romd = memory_region_is_romd(section->mr);

    if (is_ram) {
        /* RAM and ROMD both have associated host memory. */
        addend = (uintptr_t)memory_region_get_ram_ptr(section->mr) + xlat;
    } else {
        /* I/O does not; force the host address to NULL. */
        addend = 0;
    }

    write_address = address;
    if (is_ram) {
        iotlb = memory_region_get_ram_addr(section->mr) + xlat;
        /*
         * Computing is_clean is expensive; avoid all that unless
         * the page is actually writable.
         */
        if (prot & PAGE_WRITE) {
            if (section->readonly) {
                write_address |= TLB_DISCARD_WRITE;
            } else if (cpu_physical_memory_is_clean(iotlb)) {
                write_address |= TLB_NOTDIRTY;
            }
        }
    } else {
        /* I/O or ROMD */
        iotlb = memory_region_section_get_iotlb(cpu, section) + xlat;
        /*
         * Writes to romd devices must go through MMIO to enable write.
         * Reads to romd devices go through the ram_ptr found above,
         * but of course reads to I/O must go through MMIO.
         */
        write_address |= TLB_MMIO;
        //if (!is_romd) {
            address = write_address;
        //}
    }

    wp_flags = cpu_watchpoint_address_matches(cpu, vaddr_page,
                                              TARGET_PAGE_SIZE);

    index = tlb_index(env, mmu_idx, vaddr_page);
    te = tlb_entry(env, mmu_idx, vaddr_page);

    /* Note that the tlb is no longer clean.  */
    tlb->c.dirty |= 1 << mmu_idx;

    /* Make sure there's no cached translation for the new page.  */
    tlb_flush_vtlb_page_locked(env, mmu_idx, vaddr_page);

    /*
     * Only evict the old entry to the victim tlb if it's for a
     * different page; otherwise just overwrite the stale data.
     */
    if (!tlb_hit_page_anyprot(env->uc, te, vaddr_page) && !tlb_entry_is_empty(te)) {
        unsigned vidx = desc->vindex++ % CPU_VTLB_SIZE;
        CPUTLBEntry *tv = &desc->vtable[vidx];

        /* Evict the old entry into the victim tlb.  */
        copy_tlb_helper_locked(tv, te);
        desc->viotlb[vidx] = desc->iotlb[index];
        tlb_n_used_entries_dec(env, mmu_idx);
    }

    /* refill the tlb */
    /*
     * At this point iotlb contains a physical section number in the lower
     * TARGET_PAGE_BITS, and either
     *  + the ram_addr_t of the page base of the target RAM (RAM)
     *  + the offset within section->mr of the page base (I/O, ROMD)
     * We subtract the vaddr_page (which is page aligned and thus won't
     * disturb the low bits) to give an offset which can be added to the
     * (non-page-aligned) vaddr of the eventual memory access to get
     * the MemoryRegion offset for the access. Note that the vaddr we
     * subtract here is that of the page base, and not the same as the
     * vaddr we add back in io_readx()/io_writex()/get_page_addr_code().
     */
    desc->iotlb[index].addr = iotlb - vaddr_page;
    desc->iotlb[index].attrs = attrs;

    /* Now calculate the new entry */
    tn.addend = addend - vaddr_page;
    tn.paddr = paddr_page;
    if (prot & PAGE_READ) {
        tn.addr_read = address;
        if (wp_flags & BP_MEM_READ) {
            tn.addr_read |= TLB_WATCHPOINT;
        }
    } else {
        tn.addr_read = -1;
    }

    if (prot & PAGE_EXEC) {
        tn.addr_code = address;
    } else {
        tn.addr_code = -1;
    }

    tn.addr_write = -1;
    if (prot & PAGE_WRITE) {
        tn.addr_write = write_address;
        if (prot & PAGE_WRITE_INV) {
            tn.addr_write |= TLB_INVALID_MASK;
        }
        if (wp_flags & BP_MEM_WRITE) {
            tn.addr_write |= TLB_WATCHPOINT;
        }
    }

    copy_tlb_helper_locked(te, &tn);
    tlb_n_used_entries_inc(env, mmu_idx);
}